

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

void freedelem(rnndelem *elem)

{
  long lVar1;
  
  cleanupvarinfo(&elem->varinfo);
  cleanuptypeinfo(&elem->typeinfo);
  if (0 < elem->subelemsnum) {
    lVar1 = 0;
    do {
      freedelem(elem->subelems[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < elem->subelemsnum);
  }
  free(elem->subelems);
  free(elem->fullname);
  free(elem->name);
  free(elem);
  return;
}

Assistant:

static void freedelem(struct rnndelem *elem) {
	int i;
	cleanupvarinfo (&elem->varinfo);
	cleanuptypeinfo(&elem->typeinfo);
	for (i = 0; i < elem->subelemsnum; i++)
		freedelem(elem->subelems[i]);
	free(elem->subelems);

	free(elem->fullname);
	free(elem->name);
	free(elem);
}